

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitRefI31
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefI31 *curr)

{
  int32_t value;
  Shareability share;
  Literal *this_00;
  undefined1 local_88 [8];
  Flow flow;
  Literal local_38;
  
  visit((Flow *)local_88,this,curr->value);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    this_00 = Flow::getSingleValue((Flow *)local_88);
    value = Literal::geti32(this_00);
    flow.breakTo.super_IString.str._M_str =
         (char *)Type::getHeapType(&(curr->super_SpecificExpression<(wasm::Expression::Id)59>).
                                    super_Expression.type);
    share = ::wasm::HeapType::getShared();
    Literal::makeI31(&local_38,value,share);
    Flow::Flow(__return_storage_ptr__,&local_38);
    ::wasm::Literal::~Literal(&local_38);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_88);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefI31(RefI31* curr) {
    NOTE_ENTER("RefI31");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    return Literal::makeI31(value.geti32(),
                            curr->type.getHeapType().getShared());
  }